

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O0

void __thiscall ObserverManager_Clear_Test::TestBody(ObserverManager_Clear_Test *this)

{
  bool bVar1;
  A *pAVar2;
  char *message;
  AssertHelper local_288;
  Message local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  allocator local_201;
  string local_200;
  A *local_1e0;
  A *a2;
  string local_1d0;
  A *local_1a0;
  A *a1;
  stringstream out;
  ostream local_188 [376];
  ObserverManager_Clear_Test *local_10;
  ObserverManager_Clear_Test *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&a1);
  pAVar2 = (A *)operator_new(0x38);
  a2._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"Tic",(allocator *)((long)&a2 + 7));
  A::A(pAVar2,local_188,&local_1d0);
  a2._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a2 + 7));
  local_1a0 = pAVar2;
  ObserverManager::subscribe<FooBarProtocol,A>(pAVar2);
  pAVar2 = (A *)operator_new(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"Tic",&local_201);
  A::A(pAVar2,local_188,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  local_1e0 = pAVar2;
  ObserverManager::subscribe<FooBarProtocol,A>(pAVar2);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Tac");
  ObserverManager::clear<FooBarProtocol>();
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19
  ;
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Tac");
  if (local_1a0 != (A *)0x0) {
    (*(local_1a0->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol[1])();
  }
  if (local_1e0 != (A *)0x0) {
    (*(local_1e0->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol[1])();
  }
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
            ((EqHelper<false> *)local_258,"\"Tic Tic Tac Tac \"","out.str()",
             (char (*) [17])"Tic Tic Tac Tac ",&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0x8d,message);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  std::__cxx11::stringstream::~stringstream((stringstream *)&a1);
  return;
}

Assistant:

TEST(ObserverManager, Clear)  {
    std::stringstream out;

    A* a1 = new A(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a1);
    
    A* a2 = new A(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a2);
    
    ObserverManager::notify(&FooBarProtocol::foo);
    ObserverManager::notify(&FooBarProtocol::bar, "Tac");
    
    ObserverManager::clear<FooBarProtocol>();
    
    ObserverManager::notify(&FooBarProtocol::foo);
    ObserverManager::notify(&FooBarProtocol::bar, "Tac");

    delete a1;
    delete a2;

    EXPECT_EQ("Tic Tic Tac Tac ", out.str());
}